

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O1

void __thiscall
t_html_generator::generate_program_toc_rows
          (t_html_generator *this,t_program *tprog,
          vector<t_program_*,_std::allocator<t_program_*>_> *finished)

{
  pointer *ppptVar1;
  iterator __position;
  size_t __n;
  int iVar2;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1;
  t_program **iter;
  t_program **pptVar3;
  t_program **include;
  pointer pptVar4;
  bool bVar5;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  t_program *local_50;
  vector<t_program_*,_std::allocator<t_program_*>_> local_48;
  
  pptVar3 = (finished->super__Vector_base<t_program_*,_std::allocator<t_program_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (finished->super__Vector_base<t_program_*,_std::allocator<t_program_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  bVar5 = pptVar3 == __position._M_current;
  local_50 = tprog;
  if (!bVar5) {
    __n = (tprog->path_)._M_string_length;
    do {
      if ((__n == ((*pptVar3)->path_)._M_string_length) &&
         ((__n == 0 ||
          (iVar2 = bcmp((tprog->path_)._M_dataplus._M_p,((*pptVar3)->path_)._M_dataplus._M_p,__n),
          iVar2 == 0)))) {
        if (!bVar5) {
          return;
        }
        break;
      }
      pptVar3 = pptVar3 + 1;
      bVar5 = pptVar3 == __position._M_current;
    } while (!bVar5);
  }
  if (__position._M_current ==
      (finished->super__Vector_base<t_program_*,_std::allocator<t_program_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<t_program*,std::allocator<t_program*>>::_M_realloc_insert<t_program*const&>
              ((vector<t_program*,std::allocator<t_program*>> *)finished,__position,&local_50);
  }
  else {
    *__position._M_current = tprog;
    ppptVar1 = &(finished->super__Vector_base<t_program_*,_std::allocator<t_program_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  generate_program_toc_row(this,local_50);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector(&local_48,&local_50->includes_);
  for (pptVar4 = local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar4 !=
      local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    generate_program_toc_rows(this,*pptVar4,finished);
  }
  if (local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_html_generator::generate_program_toc_rows(t_program* tprog,
                                                 std::vector<t_program*>& finished) {
  for (auto & iter : finished) {
    if (tprog->get_path() == iter->get_path()) {
      return;
    }
  }
  finished.push_back(tprog);
  generate_program_toc_row(tprog);
  vector<t_program*> includes = tprog->get_includes();
  for (auto & include : includes) {
    generate_program_toc_rows(include, finished);
  }
}